

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# isprint.c
# Opt level: O1

int main(void)

{
  ushort **ppuVar1;
  
  ppuVar1 = __ctype_b_loc();
  if ((*(byte *)((long)*ppuVar1 + 0xc3) & 0x40) == 0) {
    TEST_RESULTS = TEST_RESULTS + 1;
    printf("FAILED: /workspace/llm4binary/github/license_c_cmakelists/DevSolar[P]pdclib/functions/ctype/isprint.c, line %d - %s\n"
           ,0x1b,"isprint( \'a\' )");
  }
  if ((*(byte *)((long)*ppuVar1 + 0xf5) & 0x40) == 0) {
    TEST_RESULTS = TEST_RESULTS + 1;
    printf("FAILED: /workspace/llm4binary/github/license_c_cmakelists/DevSolar[P]pdclib/functions/ctype/isprint.c, line %d - %s\n"
           ,0x1c,"isprint( \'z\' )");
  }
  if ((*(byte *)((long)*ppuVar1 + 0x83) & 0x40) == 0) {
    TEST_RESULTS = TEST_RESULTS + 1;
    printf("FAILED: /workspace/llm4binary/github/license_c_cmakelists/DevSolar[P]pdclib/functions/ctype/isprint.c, line %d - %s\n"
           ,0x1d,"isprint( \'A\' )");
  }
  if ((*(byte *)((long)*ppuVar1 + 0xb5) & 0x40) == 0) {
    TEST_RESULTS = TEST_RESULTS + 1;
    printf("FAILED: /workspace/llm4binary/github/license_c_cmakelists/DevSolar[P]pdclib/functions/ctype/isprint.c, line %d - %s\n"
           ,0x1e,"isprint( \'Z\' )");
  }
  if ((*(byte *)((long)*ppuVar1 + 0x81) & 0x40) == 0) {
    TEST_RESULTS = TEST_RESULTS + 1;
    printf("FAILED: /workspace/llm4binary/github/license_c_cmakelists/DevSolar[P]pdclib/functions/ctype/isprint.c, line %d - %s\n"
           ,0x1f,"isprint( \'@\' )");
  }
  if ((*(byte *)((long)*ppuVar1 + 0x13) & 0x40) != 0) {
    TEST_RESULTS = TEST_RESULTS + 1;
    printf("FAILED: /workspace/llm4binary/github/license_c_cmakelists/DevSolar[P]pdclib/functions/ctype/isprint.c, line %d - %s\n"
           ,0x20,"! isprint( \'\\t\' )");
  }
  if ((**ppuVar1 & 0x4000) != 0) {
    TEST_RESULTS = TEST_RESULTS + 1;
    printf("FAILED: /workspace/llm4binary/github/license_c_cmakelists/DevSolar[P]pdclib/functions/ctype/isprint.c, line %d - %s\n"
           ,0x21,"! isprint( \'\\0\' )");
  }
  if ((*(byte *)((long)*ppuVar1 + 0x41) & 0x40) == 0) {
    TEST_RESULTS = TEST_RESULTS + 1;
    printf("FAILED: /workspace/llm4binary/github/license_c_cmakelists/DevSolar[P]pdclib/functions/ctype/isprint.c, line %d - %s\n"
           ,0x22,"isprint( \' \' )");
  }
  return TEST_RESULTS;
}

Assistant:

int main( void )
{
    TESTCASE( isprint( 'a' ) );
    TESTCASE( isprint( 'z' ) );
    TESTCASE( isprint( 'A' ) );
    TESTCASE( isprint( 'Z' ) );
    TESTCASE( isprint( '@' ) );
    TESTCASE( ! isprint( '\t' ) );
    TESTCASE( ! isprint( '\0' ) );
    TESTCASE( isprint( ' ' ) );
    return TEST_RESULTS;
}